

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint ucvector_reserve(ucvector *p,size_t size)

{
  size_t new_size;
  uchar *puVar1;
  void *data;
  size_t newsize;
  size_t size_local;
  ucvector *p_local;
  
  if (p->allocsize < size) {
    new_size = size + (p->allocsize >> 1);
    puVar1 = (uchar *)lodepng_realloc(p->data,new_size);
    if (puVar1 == (uchar *)0x0) {
      return 0;
    }
    p->allocsize = new_size;
    p->data = puVar1;
  }
  return 1;
}

Assistant:

static unsigned ucvector_reserve(ucvector* p, size_t size) {
  if(size > p->allocsize) {
    size_t newsize = size + (p->allocsize >> 1u);
    void* data = lodepng_realloc(p->data, newsize);
    if(data) {
      p->allocsize = newsize;
      p->data = (unsigned char*)data;
    }
    else return 0; /*error: not enough memory*/
  }
  return 1; /*success*/
}